

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

QDBusObjectPath * qvariant_cast<QDBusObjectPath>(QVariant *v)

{
  long lVar1;
  bool bVar2;
  QMetaType QVar3;
  QMetaType *pQVar4;
  void *pvVar5;
  Private *in_RDI;
  long in_FS_OFFSET;
  QDBusObjectPath *t;
  QMetaType targetType;
  QDBusObjectPath *in_stack_ffffffffffffffa8;
  Private *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  QVar3 = QMetaType::fromType<QDBusObjectPath>();
  QVariant::Private::type(this);
  bVar2 = operator==((QMetaType *)this,(QMetaType *)in_stack_ffffffffffffffa8);
  if (bVar2) {
    QVariant::Private::get<QDBusObjectPath>((Private *)0x128e11);
    QDBusObjectPath::QDBusObjectPath((QDBusObjectPath *)this,in_stack_ffffffffffffffa8);
  }
  else {
    (this->data).shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
    *(undefined8 *)((long)&this->data + 8) = 0xaaaaaaaaaaaaaaaa;
    *(undefined8 *)((long)&this->data + 0x10) = 0xaaaaaaaaaaaaaaaa;
    QDBusObjectPath::QDBusObjectPath((QDBusObjectPath *)0x128e52);
    pQVar4 = (QMetaType *)QVariant::metaType();
    pvVar5 = QVariant::constData((QVariant *)0x128e6b);
    QMetaType::convert(pQVar4,pvVar5,(QMetaType *)QVar3.d_ptr,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QDBusObjectPath *)in_RDI;
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}